

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O0

_Bool bitset_container_select
                (bitset_container_t *container,uint32_t *start_rank,uint32_t rank,uint32_t *element)

{
  uint64_t *puVar1;
  ulong uVar2;
  int iVar3;
  int r;
  uint64_t t;
  uint64_t uStack_50;
  uint16_t base;
  uint64_t w;
  int i;
  int32_t size;
  uint64_t *words;
  int card;
  uint32_t *element_local;
  uint32_t rank_local;
  uint32_t *start_rank_local;
  bitset_container_t *container_local;
  
  iVar3 = bitset_container_cardinality(container);
  if (*start_rank + iVar3 <= rank) {
    *start_rank = iVar3 + *start_rank;
    return false;
  }
  puVar1 = container->words;
  w._0_4_ = 0;
  do {
    if (0x3ff < (int)(uint)w) {
      __assert_fail("false",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/RoaringBitmap[P]croaring_cmake_demo_from_single_header/dependencies/croaring/roaring.c"
                    ,0x2c3c,
                    "_Bool bitset_container_select(const bitset_container_t *, uint32_t *, uint32_t, uint32_t *)"
                   );
    }
    iVar3 = hamming(puVar1[(int)(uint)w]);
    if (*start_rank + iVar3 < rank) {
      *start_rank = iVar3 + *start_rank;
    }
    else {
      uStack_50 = container->words[(int)(uint)w];
      while (uStack_50 != 0) {
        iVar3 = 0;
        for (uVar2 = uStack_50; (uVar2 & 1) == 0; uVar2 = uVar2 >> 1 | 0x8000000000000000) {
          iVar3 = iVar3 + 1;
        }
        if (*start_rank == rank) {
          *element = iVar3 + ((uint)w & 0x3ff) * 0x40;
          return true;
        }
        uStack_50 = uStack_50 & (uStack_50 ^ 0xffffffffffffffff) + 1 ^ uStack_50;
        *start_rank = *start_rank + 1;
      }
    }
    w._0_4_ = (uint)w + 1;
  } while( true );
}

Assistant:

bool bitset_container_select(const bitset_container_t *container, uint32_t *start_rank, uint32_t rank, uint32_t *element) {
    int card = bitset_container_cardinality(container);
    if(rank >= *start_rank + card) {
        *start_rank += card;
        return false;
    }
    const uint64_t *words = container->words;
    int32_t size;
    for (int i = 0; i < BITSET_CONTAINER_SIZE_IN_WORDS; i += 1) {
        size = hamming(words[i]);
        if(rank <= *start_rank + size) {
            uint64_t w = container->words[i];
            uint16_t base = i*64;
            while (w != 0) {
                uint64_t t = w & (~w + 1);
                int r = __builtin_ctzll(w);
                if(*start_rank == rank) {
                    *element = r+base;
                    return true;
                }
                w ^= t;
                *start_rank += 1;
            }
        }
        else
            *start_rank += size;
    }
    assert(false);
    __builtin_unreachable();
}